

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STP_Feature.cpp
# Opt level: O0

bool __thiscall sch::s_STP_VVR::operator==(s_STP_VVR *this,s_STP_VVR *vvr)

{
  double dVar1;
  double *pdVar2;
  double epsilon;
  s_STP_VVR *vvr_local;
  s_STP_VVR *this_local;
  
  pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&this->m_axis,0);
  dVar1 = *pdVar2;
  pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&vvr->m_axis,0);
  if (ABS(dVar1 - *pdVar2) < 1e-07) {
    pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&this->m_axis,1);
    dVar1 = *pdVar2;
    pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&vvr->m_axis,1);
    if (ABS(dVar1 - *pdVar2) < 1e-07) {
      pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&this->m_axis,2);
      dVar1 = *pdVar2;
      pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&vvr->m_axis,2);
      if ((ABS(dVar1 - *pdVar2) < 1e-07) && (ABS(this->m_cosangle - vvr->m_cosangle) < 1e-07)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool s_STP_VVR::operator==(const s_STP_VVR & vvr) const
{
  double epsilon = 1e-7;

  if((fabs(m_axis[0] - vvr.m_axis[0]) < epsilon) && (fabs(m_axis[1] - vvr.m_axis[1]) < epsilon)
     && (fabs(m_axis[2] - vvr.m_axis[2]) < epsilon) && (fabs(m_cosangle - vvr.m_cosangle) < epsilon))
    return true;
  else
    return false;
}